

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O3

RGBA __thiscall glcts::DrawBuffersIndexedBlending::GetEpsilon(DrawBuffersIndexedBlending *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  int iVar3;
  int *piVar4;
  long lVar5;
  double dVar6;
  UVec4 epsilon;
  IVec4 bits;
  uint local_48 [8];
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  iVar3 = 0xd52;
  lVar5 = 0;
  do {
    piVar4 = (int *)((long)local_48 + lVar5 + 0x10);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(iVar3,piVar4);
    dVar6 = ldexp(1.0,*piVar4);
    dVar6 = ceil((1.0 / dVar6) * 255.0 + 1.0);
    uVar2 = (uint)(long)dVar6;
    if (0xfe < uVar2) {
      uVar2 = 0xff;
    }
    *(uint *)((long)local_48 + lVar5) = uVar2;
    iVar3 = iVar3 + 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  return (RGBA)(local_48[1] << 8 | local_48[0] | local_48[2] << 0x10 | local_48[3] << 0x18);
}

Assistant:

tcu::RGBA DrawBuffersIndexedBlending::GetEpsilon()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	tcu::IVec4 bits;
	tcu::UVec4 epsilon;

	for (int i = 0; i < 4; ++i)
	{
		gl.getIntegerv(GL_RED_BITS + i, &bits[i]);
		epsilon[i] = de::min(
			255u, static_cast<unsigned int>(ceil(1.0 + 255.0 * (1.0 / pow(2.0, static_cast<double>(bits[i]))))));
	}

	return tcu::RGBA(epsilon.x(), epsilon.y(), epsilon.z(), epsilon.w());
}